

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_embed_optimize_for.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestEmbedOptimizedForSize::_InternalSerialize
          (TestEmbedOptimizedForSize *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  TestOptimizedForSize *value;
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  RepeatedPtrField<proto2_unittest::TestOptimizedForSize> *this_00;
  const_reference this_01;
  UnknownFieldSet *unknown_fields;
  TestOptimizedForSize *repfield;
  uint local_30;
  uint n;
  uint i;
  uint32_t cached_has_bits;
  TestEmbedOptimizedForSize *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestEmbedOptimizedForSize *this_local;
  
  puVar4 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  stream_local = (EpsCopyOutputStream *)target;
  if ((*puVar4 & 1) != 0) {
    value = (this->field_0)._impl_.optional_message_;
    iVar2 = TestOptimizedForSize::GetCachedSize((this->field_0)._impl_.optional_message_);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (1,(MessageLite *)value,iVar2,target,stream);
  }
  local_30 = 0;
  uVar3 = _internal_repeated_message_size(this);
  for (; local_30 < uVar3; local_30 = local_30 + 1) {
    this_00 = _internal_repeated_message(this);
    this_01 = google::protobuf::RepeatedPtrField<proto2_unittest::TestOptimizedForSize>::Get
                        (this_00,local_30);
    iVar2 = TestOptimizedForSize::GetCachedSize(this_01);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_01,iVar2,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestEmbedOptimizedForSize::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestEmbedOptimizedForSize& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestEmbedOptimizedForSize)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // optional .proto2_unittest.TestOptimizedForSize optional_message = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
        1, *this_._impl_.optional_message_, this_._impl_.optional_message_->GetCachedSize(), target,
        stream);
  }

  // repeated .proto2_unittest.TestOptimizedForSize repeated_message = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_repeated_message_size());
       i < n; i++) {
    const auto& repfield = this_._internal_repeated_message().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestEmbedOptimizedForSize)
  return target;
}